

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

istream * nuraft::operator>>(istream *in,buffer *buf)

{
  long lVar1;
  char *pcVar2;
  
  if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
    if ((int)*(uint *)buf < 0) {
      lVar1 = (ulong)*(uint *)(buf + 4) + 8;
    }
    else {
      lVar1 = (ulong)(*(uint *)buf >> 0x10) + 4;
    }
    std::istream::read((char *)in,(long)(buf + lVar1));
    if (((byte)in[*(long *)(*(long *)in + -0x18) + 0x20] & 5) == 0) {
      return in;
    }
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"read failed");
  }
  else {
    pcVar2 = (char *)__cxa_allocate_exception(0x20);
    std::iostream_category();
    std::ios_base::failure[abi:cxx11]::failure(pcVar2,(error_code *)"bad input stream");
  }
  __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
              std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

std::istream& nuraft::operator >> (std::istream& in, buffer& buf) {
    if (!in) {
        throw std::ios::failure("bad input stream");
    }

    char* data = reinterpret_cast<char*>(buf.data());
    int size = buf.size() - buf.pos();
    in.read(data, size);

    if (!in) {
        throw std::ios::failure("read failed");
    }

    return in;
}